

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

Rwt_Node_t * Rwt_ManAddVar(Rwt_Man_t *p,uint uTruth,int fPrecompute)

{
  Rwt_Node_t *pNode;
  Rwt_Node_t **ppList;
  
  pNode = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0x8 = uTruth & 0xffff | 0x40000000;
  pNode->p0 = (Rwt_Node_t *)0x0;
  pNode->p1 = (Rwt_Node_t *)0x0;
  pNode->pNext = (Rwt_Node_t *)0x0;
  Vec_PtrPush(p->vForest,pNode);
  if (fPrecompute != 0) {
    Rwt_ListAddToTail(ppList,pNode);
  }
  return pNode;
}

Assistant:

Rwt_Node_t * Rwt_ManAddVar( Rwt_Man_t * p, unsigned uTruth, int fPrecompute )
{
    Rwt_Node_t * pNew;
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = 0;
    pNew->Volume = 0;
    pNew->fUsed  = 1;
    pNew->fExor  = 0;
    pNew->p0     = NULL;
    pNew->p1     = NULL;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    if ( fPrecompute )
        Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}